

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVec2 *lhs;
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiGroupData *pIVar9;
  char cVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect group_bb;
  ImRect local_70;
  ImVec2 local_60;
  ImGuiContext *local_58;
  ImGuiGroupData *local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  local_58 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  pIVar6 = (pIVar5->DC).GroupStack.Data;
  iVar11 = (pIVar5->DC).GroupStack.Size;
  local_50 = pIVar6 + iVar11;
  lhs = &(pIVar5->DC).CursorMaxPos;
  local_70.Max = ImMax(lhs,&pIVar6[(long)iVar11 + -1].BackupCursorPos);
  local_70.Min = pIVar6[(long)iVar11 + -1].BackupCursorPos;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = local_70.Max.x;
  local_48._4_4_ = local_70.Max.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  (pIVar5->DC).CursorPos = local_70.Min;
  local_60 = local_70.Min;
  IVar7 = ImMax(&pIVar6[(long)iVar11 + -1].BackupCursorMaxPos,lhs);
  pIVar9 = local_50;
  pIVar8 = local_58;
  (pIVar5->DC).CursorMaxPos = IVar7;
  (pIVar5->DC).Indent.x = pIVar6[(long)iVar11 + -1].BackupIndent.x;
  (pIVar5->DC).GroupOffset.x = pIVar6[(long)iVar11 + -1].BackupGroupOffset.x;
  (pIVar5->DC).CurrLineSize = pIVar6[(long)iVar11 + -1].BackupCurrLineSize;
  fVar2 = pIVar6[(long)iVar11 + -1].BackupCurrLineTextBaseOffset;
  (pIVar5->DC).CurrLineTextBaseOffset = fVar2;
  if (local_58->LogEnabled == true) {
    local_58->LogLinePosY = -3.4028235e+38;
  }
  if (local_50[-1].EmitItem != true) goto LAB_00152576;
  fVar3 = (pIVar5->DC).PrevLineTextBaseOffset;
  uVar13 = -(uint)(fVar2 <= fVar3);
  (pIVar5->DC).CurrLineTextBaseOffset = (float)(~uVar13 & (uint)fVar2 | (uint)fVar3 & uVar13);
  local_38.y = (float)local_48._4_4_ - local_60.y;
  local_38.x = (float)local_48._0_4_ - local_60.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&local_70,0,(ImRect *)0x0);
  IVar4 = pIVar8->ActiveId;
  if (pIVar9[-1].BackupActiveIdIsAlive == IVar4) {
    if (pIVar9[-1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar10 = pIVar8->ActiveIdPreviousFrameIsAlive;
joined_r0x0015252d:
      if (cVar10 == '\0') goto LAB_0015252f;
      (pIVar5->DC).LastItemId = pIVar8->ActiveIdPreviousFrame;
      cVar10 = '\x01';
    }
    else {
LAB_0015252f:
      cVar10 = '\0';
    }
LAB_00152531:
    (pIVar5->DC).LastItemRect.Min = local_70.Min;
    (pIVar5->DC).LastItemRect.Max = local_70.Max;
    uVar13 = (pIVar5->DC).LastItemStatusFlags;
    (pIVar5->DC).LastItemStatusFlags = uVar13 | 0x20;
joined_r0x00152597:
    if (cVar10 != '\0') {
LAB_0015255c:
      if (pIVar8->ActiveId != pIVar8->ActiveIdPreviousFrame) {
        (pIVar5->DC).LastItemStatusFlags = uVar13 | 0x60;
      }
    }
  }
  else {
    bVar12 = pIVar8->ActiveIdIsAlive != IVar4;
    if (pIVar9[-1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar10 = pIVar8->ActiveIdPreviousFrameIsAlive;
      if (IVar4 == 0 || bVar12) goto joined_r0x0015252d;
    }
    else {
      cVar10 = '\0';
      if (IVar4 == 0 || bVar12) goto LAB_00152531;
    }
    (pIVar5->DC).LastItemId = IVar4;
    (pIVar5->DC).LastItemRect.Min = local_70.Min;
    (pIVar5->DC).LastItemRect.Max = local_70.Max;
    pIVar1 = &(pIVar5->DC).LastItemStatusFlags;
    uVar13 = (pIVar5->DC).LastItemStatusFlags;
    if (pIVar8->ActiveIdHasBeenEditedThisFrame != true) {
      *pIVar1 = uVar13 | 0x20;
      goto joined_r0x00152597;
    }
    *pIVar1 = uVar13 | 0x24;
    if (cVar10 != '\0') {
      uVar13 = uVar13 | 4;
      goto LAB_0015255c;
    }
  }
  iVar11 = (pIVar5->DC).GroupStack.Size;
LAB_00152576:
  (pIVar5->DC).GroupStack.Size = iVar11 + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}